

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equalizer.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_16da50::EqualizerState::deviceUpdate(EqualizerState *this,ALCdevice *param_1)

{
  float *pfVar1;
  long lVar2;
  long lVar3;
  anon_struct_240_3_8d696fa7 *paVar4;
  long lVar5;
  
  paVar4 = this->mChans;
  lVar2 = 0x20;
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      *(undefined8 *)((long)&paVar4->filter[0].mZ1 + lVar5) = 0;
      lVar5 = lVar5 + 0x1c;
    } while (lVar5 != 0x70);
    pfVar1 = this->mChans[lVar3].CurrentGains;
    pfVar1[0xc] = 0.0;
    pfVar1[0xd] = 0.0;
    pfVar1[0xe] = 0.0;
    pfVar1[0xf] = 0.0;
    pfVar1 = this->mChans[lVar3].CurrentGains;
    pfVar1[8] = 0.0;
    pfVar1[9] = 0.0;
    pfVar1[10] = 0.0;
    pfVar1[0xb] = 0.0;
    pfVar1 = this->mChans[lVar3].CurrentGains;
    pfVar1[4] = 0.0;
    pfVar1[5] = 0.0;
    pfVar1[6] = 0.0;
    pfVar1[7] = 0.0;
    pfVar1 = this->mChans[lVar3].CurrentGains;
    pfVar1[0] = 0.0;
    pfVar1[1] = 0.0;
    pfVar1[2] = 0.0;
    pfVar1[3] = 0.0;
    lVar2 = lVar2 + 0xf0;
    lVar3 = lVar3 + 1;
    paVar4 = paVar4 + 1;
  } while (lVar2 != 0xf20);
  return;
}

Assistant:

void EqualizerState::deviceUpdate(const ALCdevice*)
{
    for(auto &e : mChans)
    {
        std::for_each(std::begin(e.filter), std::end(e.filter), std::mem_fn(&BiquadFilter::clear));
        std::fill(std::begin(e.CurrentGains), std::end(e.CurrentGains), 0.0f);
    }
}